

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O0

void __thiscall QHttpSocketEngine::slotSocketConnected(QHttpSocketEngine *this)

{
  bool bVar1;
  QHttpSocketEnginePrivate *pQVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QStringBuilder<QByteArray_&,_char> QVar4;
  QAuthenticatorPrivate *priv;
  qsizetype i;
  QByteArrayView in_stack_00000050;
  QHttpSocketEnginePrivate *d;
  undefined1 in_stack_000000c0 [16];
  QLatin1StringView name;
  QHttpHeaders headers;
  QByteArray data;
  QByteArray path;
  QByteArray peerAddress;
  char method [8];
  QStringBuilder<QStringBuilder<QStringBuilder<QByteArrayView,_const_char_(&)[3]>,_QByteArrayView>,_const_char_(&)[3]>
  *in_stack_fffffffffffffd68;
  QStringBuilder<QStringBuilder<QByteArrayView,_const_char_(&)[3]>,_QByteArrayView>
  *in_stack_fffffffffffffd70;
  QStringBuilder<QByteArray_&,_char> *in_stack_fffffffffffffd78;
  QStringView *in_stack_fffffffffffffd80;
  QHostAddress *in_stack_fffffffffffffd88;
  QHttpHeaders *in_stack_fffffffffffffd90;
  QAuthenticatorPrivate *pQVar5;
  QAuthenticatorPrivate *this_00;
  QStringBuilder<QStringBuilder<QStringBuilder<QByteArrayView,_const_char_(&)[3]>,_QByteArrayView>,_const_char_(&)[3]>
  *local_218;
  QStringBuilder<QStringBuilder<QByteArrayView,_const_char_(&)[3]>,_QByteArrayView> *local_210;
  QLatin1StringView local_120;
  undefined8 local_110;
  QStringBuilder<const_char_(&)[7],_QByteArray_&> local_108;
  QByteArray local_e0;
  undefined1 local_c8 [24];
  QByteArray *local_b0;
  char local_a8;
  undefined1 local_99;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined1 local_7c [28];
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  QByteArray *local_48;
  char local_40;
  char local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QHttpSocketEngine *)0x33ac4b);
  builtin_strncpy(local_10,"CONNECT",8);
  local_60 = 0xaaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaaaaaaaaaa;
  local_50 = 0xaaaaaaaaaaaaaaaa;
  bVar1 = QString::isEmpty((QString *)0x33ac9d);
  if (bVar1) {
    QHostAddress::toString(in_stack_fffffffffffffd88);
    QString::toLatin1((QString *)in_stack_fffffffffffffd68);
    QString::~QString((QString *)0x33ad3d);
  }
  else {
    memset(local_7c,0,4);
    QFlags<QUrl::AceProcessingOption>::QFlags((QFlags<QUrl::AceProcessingOption> *)0x33ad0e);
    QUrl::toAce((QString *)&local_60,(QFlags_conflict *)&pQVar2->peerName);
  }
  local_98 = 0xaaaaaaaaaaaaaaaa;
  uStack_90 = 0xaaaaaaaaaaaaaaaa;
  local_88 = 0xaaaaaaaaaaaaaaaa;
  local_99 = 0x3a;
  QVar4 = ::operator+((QByteArray *)in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70);
  local_b0 = QVar4.a;
  local_a8 = QVar4.b;
  local_48 = local_b0;
  local_40 = local_a8;
  QByteArray::number((int)local_c8,(uint)(pQVar2->super_QAbstractSocketEnginePrivate).peerPort);
  ::operator+(in_stack_fffffffffffffd78,(QByteArray *)in_stack_fffffffffffffd70);
  ::QStringBuilder::operator_cast_to_QByteArray
            ((QStringBuilder<QStringBuilder<QByteArray_&,_char>,_QByteArray> *)
             in_stack_fffffffffffffd68);
  QStringBuilder<QStringBuilder<QByteArray_&,_char>,_QByteArray>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QByteArray_&,_char>,_QByteArray> *)0x33ae05);
  QByteArray::~QByteArray((QByteArray *)0x33ae12);
  local_e0.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_e0.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_e0.d.size = -0x5555555555555556;
  QByteArray::QByteArray(&local_e0,local_10,-1);
  QByteArray::operator+=
            ((QByteArray *)in_stack_fffffffffffffd70,
             (char)((ulong)in_stack_fffffffffffffd68 >> 0x38));
  QByteArray::operator+=
            ((QByteArray *)in_stack_fffffffffffffd70,(QByteArray *)in_stack_fffffffffffffd68);
  QByteArray::operator+=((QByteArray *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
  QByteArray::operator+=((QByteArray *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
  local_108 = ::operator+((char (*) [7])in_stack_fffffffffffffd70,
                          (QByteArray *)in_stack_fffffffffffffd68);
  ::operator+((QStringBuilder<const_char_(&)[7],_QByteArray_&> *)in_stack_fffffffffffffd70,
              (char (*) [3])in_stack_fffffffffffffd68);
  ::operator+=((QByteArray *)in_stack_fffffffffffffd70,
               (QStringBuilder<QStringBuilder<const_char_(&)[7],_QByteArray_&>,_const_char_(&)[3]> *
               )in_stack_fffffffffffffd68);
  local_110 = 0xaaaaaaaaaaaaaaaa;
  QNetworkProxy::headers((QNetworkProxy *)in_stack_fffffffffffffd78);
  bVar1 = QHttpHeaders::contains
                    (in_stack_fffffffffffffd90,
                     (WellKnownHeader)((ulong)in_stack_fffffffffffffd88 >> 0x20));
  if (!bVar1) {
    QByteArray::operator+=
              ((QByteArray *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
  }
  pQVar5 = (QAuthenticatorPrivate *)0x0;
  while (this_00 = pQVar5, qVar3 = QHttpHeaders::size((QHttpHeaders *)in_stack_fffffffffffffd68),
        (long)pQVar5 < qVar3) {
    local_120.m_data = (char *)0xaaaaaaaaaaaaaaaa;
    local_120.m_size = -0x5555555555555556;
    local_120 = QHttpHeaders::nameAt(in_stack_fffffffffffffd90,(qsizetype)in_stack_fffffffffffffd88)
    ;
    in_stack_fffffffffffffd90 = (QHttpHeaders *)QLatin1String::data(&local_120);
    QLatin1String::size(&local_120);
    QByteArrayView::QByteArrayView<char,_true>
              ((QByteArrayView *)in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
               (qsizetype)in_stack_fffffffffffffd70);
    ::operator+((QByteArrayView *)in_stack_fffffffffffffd70,(char (*) [3])in_stack_fffffffffffffd68)
    ;
    QHttpHeaders::valueAt
              ((QHttpHeaders *)in_stack_fffffffffffffd80,(qsizetype)in_stack_fffffffffffffd78);
    ::operator+(&in_stack_fffffffffffffd70->a,(QByteArrayView *)in_stack_fffffffffffffd68);
    ::operator+(in_stack_fffffffffffffd70,(char (*) [3])in_stack_fffffffffffffd68);
    ::operator+=((QByteArray *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    pQVar5 = (QAuthenticatorPrivate *)((long)&(this_00->user).d.d + 1);
  }
  pQVar5 = QAuthenticatorPrivate::getPrivate(&pQVar2->authenticator);
  if ((pQVar5 != (QAuthenticatorPrivate *)0x0) && (pQVar5->method != None)) {
    pQVar2->credentialsSent = true;
    QByteArrayView::QByteArrayView<8ul>
              ((QByteArrayView *)in_stack_fffffffffffffd80,(char (*) [8])in_stack_fffffffffffffd78);
    QByteArrayView::QByteArrayView<QByteArray,_true>
              ((QByteArrayView *)in_stack_fffffffffffffd80,(QByteArray *)in_stack_fffffffffffffd78);
    QNetworkProxy::hostName((QNetworkProxy *)in_stack_fffffffffffffd78);
    QStringView::QStringView<QString,_true>
              (in_stack_fffffffffffffd80,(QString *)in_stack_fffffffffffffd78);
    QAuthenticatorPrivate::calculateResponse
              (this_00,in_stack_00000050,(QByteArrayView)_priv,(QStringView)in_stack_000000c0);
    ::operator+((char (*) [22])in_stack_fffffffffffffd78,(QByteArray *)local_210);
    ::operator+=((QByteArray *)local_210,(QStringBuilder<const_char_(&)[22],_QByteArray> *)local_218
                );
    QStringBuilder<const_char_(&)[22],_QByteArray>::~QStringBuilder
              ((QStringBuilder<const_char_(&)[22],_QByteArray> *)0x33b1b6);
    QByteArray::~QByteArray((QByteArray *)0x33b1c3);
    QString::~QString((QString *)0x33b1cd);
    QByteArray::operator+=((QByteArray *)local_210,(char *)local_218);
    in_stack_fffffffffffffd68 = local_218;
    in_stack_fffffffffffffd70 = local_210;
  }
  QByteArray::operator+=((QByteArray *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
  QIODevice::write((QByteArray *)pQVar2->socket);
  pQVar2->state = ConnectSent;
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x33b22c);
  QByteArray::~QByteArray((QByteArray *)0x33b236);
  QByteArray::~QByteArray((QByteArray *)0x33b243);
  QByteArray::~QByteArray((QByteArray *)0x33b250);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpSocketEngine::slotSocketConnected()
{
    Q_D(QHttpSocketEngine);

    // Send the greeting.
    const char method[] = "CONNECT";
    QByteArray peerAddress = d->peerName.isEmpty() ?
                             d->peerAddress.toString().toLatin1() :
                             QUrl::toAce(d->peerName);
    QByteArray path = peerAddress + ':' + QByteArray::number(d->peerPort);
    QByteArray data = method;
    data += ' ';
    data += path;
    data += " HTTP/1.1\r\n";
    data += "Proxy-Connection: keep-alive\r\n";
    data += "Host: " + peerAddress + "\r\n";
    const auto headers = d->proxy.headers();
    if (!headers.contains(QHttpHeaders::WellKnownHeader::UserAgent))
        data += "User-Agent: Mozilla/5.0\r\n";
    for (qsizetype i = 0; i < headers.size(); ++i) {
        const auto name = headers.nameAt(i);
        data += QByteArrayView(name.data(), name.size()) + ": "
                + headers.valueAt(i) + "\r\n";
    }
    QAuthenticatorPrivate *priv = QAuthenticatorPrivate::getPrivate(d->authenticator);
    //qDebug() << "slotSocketConnected: priv=" << priv << (priv ? (int)priv->method : -1);
    if (priv && priv->method != QAuthenticatorPrivate::None) {
        d->credentialsSent = true;
        data += "Proxy-Authorization: " + priv->calculateResponse(method, path, d->proxy.hostName());
        data += "\r\n";
    }
    data += "\r\n";
//     qDebug() << ">>>>>>>> sending request" << this;
//     qDebug() << data;
//     qDebug(">>>>>>>");
    d->socket->write(data);
    d->state = ConnectSent;
}